

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_ldm_fillHashTable(ldmState_t *state,BYTE *ip,BYTE *iend,ldmParams_t *params)

{
  uint uVar1;
  U64 lastHash;
  
  uVar1 = params->minMatchLength;
  lastHash = ZSTD_rollingHash_compute(ip,(ulong)uVar1);
  ZSTD_ldm_fillLdmHashTable
            (state,lastHash,ip,iend + -(ulong)uVar1,(state->window).base,
             params->hashLog - params->bucketSizeLog,*params);
  return;
}

Assistant:

void ZSTD_ldm_fillHashTable(
            ldmState_t* state, const BYTE* ip,
            const BYTE* iend, ldmParams_t const* params)
{
    U64 startingHash = ZSTD_rollingHash_compute(ip, params->minMatchLength);
    ZSTD_ldm_fillLdmHashTable(
        state, startingHash, ip, iend - params->minMatchLength, state->window.base,
        params->hashLog - params->bucketSizeLog,
        *params);
}